

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

Expression * __thiscall wasm::Builder::makeConstantExpression(Builder *this,Literals *values)

{
  Type *this_00;
  TupleMake *pTVar1;
  long lVar2;
  Literal *other;
  long lVar3;
  undefined1 local_c0 [8];
  value_type value;
  Literal local_90;
  Expression *local_78;
  Literal *local_70;
  Literals *local_68;
  long local_60;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> consts;
  
  local_60 = ((long)(values->super_SmallVector<wasm::Literal,_1UL>).flexible.
                    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(values->super_SmallVector<wasm::Literal,_1UL>).flexible.
                    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
             (values->super_SmallVector<wasm::Literal,_1UL>).usedFixed;
  if (local_60 == 1) {
    Literal::Literal(&local_90,(values->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems);
    pTVar1 = (TupleMake *)makeConstantExpression(this,&local_90);
    Literal::~Literal(&local_90);
  }
  else {
    if (local_60 == 0) {
      __assert_fail("values.size() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                    ,0x512,"Expression *wasm::Builder::makeConstantExpression(Literals)");
    }
    auStack_58 = (undefined1  [8])0x0;
    consts.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    consts.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_70 = (values->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems;
    lVar2 = -0x18;
    lVar3 = 0;
    local_68 = values;
    do {
      other = (Literal *)
              ((long)&((local_68->super_SmallVector<wasm::Literal,_1UL>).flexible.
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_start)->field_0 + lVar2);
      if (lVar3 == 0) {
        other = local_70;
      }
      Literal::Literal((Literal *)local_c0,other);
      this_00 = &value.type;
      Literal::Literal((Literal *)this_00,(Literal *)local_c0);
      local_78 = makeConstantExpression(this,(Literal *)this_00);
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_58,&local_78
                );
      Literal::~Literal((Literal *)this_00);
      Literal::~Literal((Literal *)local_c0);
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x18;
    } while (local_60 != lVar3);
    pTVar1 = makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&>
                       (this,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             auStack_58);
    if (auStack_58 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_58,
                      (long)consts.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
    }
  }
  return (Expression *)pTVar1;
}

Assistant:

Expression* makeConstantExpression(Literals values) {
    assert(values.size() > 0);
    if (values.size() == 1) {
      return makeConstantExpression(values[0]);
    } else {
      std::vector<Expression*> consts;
      for (auto value : values) {
        consts.push_back(makeConstantExpression(value));
      }
      return makeTupleMake(consts);
    }
  }